

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::RemoveLast(Reflection *this,Message *message,FieldDescriptor *field)

{
  int *piVar1;
  bool bVar2;
  CppType CVar3;
  uint32 uVar4;
  MapFieldBase *this_00;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"RemoveLast","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"RemoveLast",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x42] != (FieldDescriptor)0x1) {
    CVar3 = FieldDescriptor::cpp_type(field);
    switch(CVar3) {
    case CPPTYPE_INT32:
    case CPPTYPE_INT64:
    case CPPTYPE_UINT32:
    case CPPTYPE_UINT64:
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_BOOL:
    case CPPTYPE_ENUM:
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      piVar1 = (int *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
      *piVar1 = *piVar1 + -1;
      break;
    case CPPTYPE_STRING:
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      internal::RepeatedPtrFieldBase::
      RemoveLast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4));
      return;
    case CPPTYPE_MESSAGE:
      bVar2 = FieldDescriptor::is_map(field);
      uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      this_00 = (MapFieldBase *)
                ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
      if (bVar2) {
        this_00 = (MapFieldBase *)internal::MapFieldBase::MutableRepeatedField(this_00);
      }
      internal::RepeatedPtrFieldBase::
      RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                ((RepeatedPtrFieldBase *)this_00);
      return;
    }
    return;
  }
  internal::ExtensionSet::RemoveLast
            ((ExtensionSet *)
             ((long)&(message->super_MessageLite)._vptr_MessageLite +
             (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44));
  return;
}

Assistant:

void Reflection::RemoveLast(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(RemoveLast);
  USAGE_CHECK_REPEATED(RemoveLast);

  if (field->is_extension()) {
    MutableExtensionSet(message)->RemoveLast(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                             \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->RemoveLast(); \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)
                ->RemoveLast();
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->RemoveLast<GenericTypeHandler<Message> >();
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->RemoveLast<GenericTypeHandler<Message> >();
        }
        break;
    }
  }
}